

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

_Bool nhdp_domain_set_incoming_metric(nhdp_domain_metric *metric,nhdp_link *lnk,uint32_t metric_in)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  list_entity *plVar4;
  nhdp_link_domaindata *pnVar5;
  list_entity *plVar6;
  _Bool local_48;
  
  if ((_domain_list.next)->prev == _domain_list.prev) {
    local_48 = false;
  }
  else {
    local_48 = false;
    plVar4 = _domain_list.prev;
    plVar6 = _domain_list.next;
    do {
      if ((nhdp_domain_metric *)plVar6[-0x28].next == metric) {
        iVar1 = *(int *)((long)&plVar6[-0x27].next + 4);
        uVar2 = metric_in;
        if ((_domain_metric_postprocessor_list.next)->prev != _domain_metric_postprocessor_list.prev
           ) {
          plVar4 = _domain_metric_postprocessor_list.next;
          do {
            uVar2 = (*(code *)plVar4[-1].prev)(plVar6 + -0x2a,lnk,uVar2);
            plVar4 = plVar4->next;
          } while (plVar4->prev != _domain_metric_postprocessor_list.prev);
        }
        pnVar5 = lnk->_domaindata + iVar1;
        if ((pnVar5->metric).in != uVar2) {
          uVar3 = oonf_clock_getNow();
          pnVar5->last_metric_change = uVar3;
          local_48 = true;
        }
        (pnVar5->metric).in = uVar2;
        plVar4 = _domain_list.prev;
      }
      plVar6 = plVar6->next;
    } while (plVar6->prev != plVar4);
  }
  return local_48;
}

Assistant:

bool
nhdp_domain_set_incoming_metric(struct nhdp_domain_metric *metric, struct nhdp_link *lnk, uint32_t metric_in) {
  struct nhdp_domain_metric_postprocessor *processor;
  struct nhdp_link_domaindata *linkdata;
  struct nhdp_domain *domain;
  uint32_t new_metric;
  bool changed;

  changed = false;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->metric == metric) {
      linkdata = nhdp_domain_get_linkdata(domain, lnk);
      new_metric = metric_in;

      list_for_each_element(&_domain_metric_postprocessor_list, processor, _node) {
        new_metric = processor->process_in_metric(domain, lnk, new_metric);
      }

      if (linkdata->metric.in != new_metric) {
        changed = true;
        linkdata->last_metric_change = oonf_clock_getNow();
      }
      linkdata->metric.in = new_metric;
    }
  }
  return changed;
}